

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void CVmObjTads::set_sc_cb(vm_obj_id_t obj,void *ctx0)

{
  undefined8 *puVar1;
  int *__ptr;
  int iVar2;
  int *piVar3;
  set_sc_cb_ctx *ctx;
  
  iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 8))
                    (G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff),metaclass_reg_);
  if (iVar2 != 0) {
    puVar1 = *(undefined8 **)((long)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 8);
    __ptr = (int *)*puVar1;
    if ((__ptr != (int *)0x0) && (iVar2 = *__ptr, iVar2 != 0)) {
      piVar3 = __ptr;
      do {
        piVar3 = piVar3 + 4;
        if (iVar2 == *ctx0) {
          free(__ptr);
          *puVar1 = 0;
          return;
        }
        iVar2 = *piVar3;
      } while (iVar2 != 0);
    }
  }
  return;
}

Assistant:

void CVmObjTads::set_sc_cb(VMG_ vm_obj_id_t obj, void *ctx0)
{
    /* if this is a TadsObject instance, update it */
    if (CVmObjTads::is_tadsobj_obj(vmg_ obj))
    {
        /* cast the context to our private structure */
        set_sc_cb_ctx *ctx = (set_sc_cb_ctx *)ctx0;

        /* get this object's header */
        vm_tadsobj_hdr *hdr = ((CVmObjTads *)vm_objp(vmg_ obj))->get_hdr();
        
        /* 
         *   if it has a cached inheritance path, check to see if it contains
         *   the object being changed 
         */
        tadsobj_objid_and_ptr *path = hdr->inh_path;
        if (path != 0)
        {
            /* scan the path for 'obj' */
            for ( ; path->id != VM_INVALID_OBJ ; ++path)
            {
                /* if this superclass is 'obj', we must delete the path */
                if (path->id == ctx->obj)
                {
                    /* we need to drop this path */
                    hdr->inval_inh_path();
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }